

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_size(connectdata *conn)

{
  CURLcode CVar1;
  
  if ((*(int *)((long)(conn->data->req).protop + 0x10) == 1) &&
     ((conn->proto).ftpc.file != (char *)0x0)) {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"SIZE %s");
    if (CVar1 == CURLE_OK) {
      (conn->proto).ftpc.state = FTP_SIZE;
      CVar1 = CURLE_OK;
    }
    return CVar1;
  }
  CVar1 = ftp_state_rest(conn);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_size(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if((ftp->transfer == FTPTRANSFER_INFO) && ftpc->file) {
    /* if a "head"-like request is being made (on a file) */

    /* we know ftpc->file is a valid pointer to a file name */
    result = Curl_pp_sendf(&ftpc->pp, "SIZE %s", ftpc->file);
    if(!result)
      state(conn, FTP_SIZE);
  }
  else
    result = ftp_state_rest(conn);

  return result;
}